

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

void cppcms_capi_session_delete(cppcms_capi_session *session)

{
  cppcms_capi_session *in_RDI;
  
  if ((in_RDI != (cppcms_capi_session *)0x0) && (in_RDI != (cppcms_capi_session *)0x0)) {
    cppcms_capi_session::~cppcms_capi_session(in_RDI);
    operator_delete(in_RDI);
  }
  return;
}

Assistant:

void cppcms_capi_session_delete(cppcms_capi_session *session)
{
	if(session) delete session;
}